

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.cpp
# Opt level: O3

void __thiscall file_hash_8::test_method(file_hash_8 *this)

{
  shared_count *this_00;
  lazy_ostream local_d0;
  undefined1 *local_c0;
  char *local_b8;
  const_string local_b0;
  undefined **local_a0;
  undefined1 local_98;
  undefined1 *local_90;
  undefined4 **local_88;
  assertion_result local_80;
  undefined **local_68;
  undefined1 local_60;
  undefined1 *local_58;
  undefined4 **local_50;
  undefined4 *local_48;
  undefined4 *local_40;
  undefined4 local_38;
  undefined1 local_31;
  
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1ba840,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x19b793);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x37;
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001b7978;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_48 = (undefined4 *)&local_31;
  local_31 = 0;
  local_40 = &local_38;
  local_38 = 0;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_b0.m_end = "";
  local_60 = 0;
  local_98 = 0;
  local_50 = &local_48;
  local_68 = &PTR__lazy_ostream_001b7cf8;
  local_58 = boost::unit_test::lazy_ostream::inst;
  local_88 = &local_40;
  local_a0 = &PTR__lazy_ostream_001b7b38;
  local_90 = boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,&local_d0,&local_b0,0x37,CHECK,CHECK_EQUAL,2,
             "ah::file_hash< std::uint8_t >( \"\" )",&local_68,"0",&local_a0);
  this_00 = &local_80.m_message.pn;
  boost::detail::shared_count::~shared_count(this_00);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1ba840,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x19b793);
  local_38 = CONCAT31(local_38._1_3_,0x61);
  local_31 = 0x61;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x38;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001b7978;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_60 = 0;
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_001b7cb8;
  local_b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_b0.m_end = "";
  local_48 = &local_38;
  local_68 = &PTR__lazy_ostream_001b7cf8;
  local_58 = boost::unit_test::lazy_ostream::inst;
  local_50 = &local_48;
  local_40 = (undefined4 *)&local_31;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = &local_40;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,&local_d0,&local_b0,0x38,CHECK,CHECK_EQUAL,2,
             "ah::file_hash< std::uint8_t >( \"a\" )",&local_68,"\'a\'",&local_a0);
  boost::detail::shared_count::~shared_count(this_00);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1ba840,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x19b793);
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x39;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001b7978;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  local_31 = 0xc3;
  local_38 = 0xc3;
  local_60 = 0;
  local_98 = 0;
  local_b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_b0.m_end = "";
  local_48 = (undefined4 *)&local_31;
  local_68 = &PTR__lazy_ostream_001b7cf8;
  local_58 = boost::unit_test::lazy_ostream::inst;
  local_50 = &local_48;
  local_40 = &local_38;
  local_a0 = &PTR__lazy_ostream_001b7b38;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = &local_40;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,&local_d0,&local_b0,0x39,CHECK,CHECK_EQUAL,2,
             "ah::file_hash< std::uint8_t >( \"ab\" )",&local_68,"\'a\' + \'b\'",&local_a0);
  boost::detail::shared_count::~shared_count(this_00);
  boost::unit_test::anon_unknown_0::s_log_impl();
  std::__cxx11::string::_M_replace
            (0x1ba840,0,
             (char *)boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.
                     m_message._M_string_length,0x19b793);
  local_d0.m_empty = false;
  local_d0._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_001b7978;
  local_c0 = boost::unit_test::lazy_ostream::inst;
  local_b8 = "";
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  local_80.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)(class_property<bool>)0x1;
  local_80.m_message.px = (element_type *)0x0;
  local_80.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_b0.m_begin =
       "/workspace/llm4binary/github/license_all_cmakelists_1510/TorstenRobitzki[P]assert_hash/tests.cpp"
  ;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_file_name.m_end = "";
  local_b0.m_end = "";
  local_48 = (undefined4 *)&local_31;
  local_60 = 0;
  local_68 = &PTR__lazy_ostream_001b7cf8;
  local_58 = boost::unit_test::lazy_ostream::inst;
  local_50 = &local_48;
  local_40 = &local_38;
  local_98 = 0;
  local_a0 = &PTR__lazy_ostream_001b7b38;
  local_90 = boost::unit_test::lazy_ostream::inst;
  local_88 = &local_40;
  boost::unit_test::anon_unknown_0::s_log_impl::the_inst.m_checkpoint_data.m_line_num = 0x3a;
  local_31 = 0x26;
  local_38 = 0x26;
  boost::test_tools::tt_detail::report_assertion
            (&local_80,&local_d0,&local_b0,0x3a,CHECK,CHECK_EQUAL,2,
             "ah::file_hash< std::uint8_t >( \"abc\" )",&local_68,"( \'a\' + \'b\' + \'c\' ) & 0xff"
             ,&local_a0);
  boost::detail::shared_count::~shared_count(&local_80.m_message.pn);
  return;
}

Assistant:

BOOST_AUTO_TEST_CASE( file_hash_8 )
{
    BOOST_CHECK_EQUAL( ah::file_hash< std::uint8_t >( "" ), 0 );
    BOOST_CHECK_EQUAL( ah::file_hash< std::uint8_t >( "a" ), 'a' );
    BOOST_CHECK_EQUAL( ah::file_hash< std::uint8_t >( "ab" ), 'a' + 'b' );
    BOOST_CHECK_EQUAL( ah::file_hash< std::uint8_t >( "abc" ), ( 'a' + 'b' + 'c' ) & 0xff );
}